

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

string * __thiscall
glcts::ArraysOfArrays::
ConstructorsAndUnsizedDeclStructConstructors<glcts::ArraysOfArrays::Interface::GL>::
recursively_initialise
          (string *__return_storage_ptr__,
          ConstructorsAndUnsizedDeclStructConstructors<glcts::ArraysOfArrays::Interface::GL> *this,
          string *var_type,size_t dimension_index,string *init_string)

{
  string *this_00;
  int iVar1;
  size_t indent_index;
  size_t sVar2;
  string local_118;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0 [32];
  string local_90 [32];
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (dimension_index == 0) {
    std::operator+(&local_d0,var_type,"(");
    std::operator+(&local_118,&local_d0,init_string);
    std::operator+(&prefix,&local_118,")");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&prefix);
    std::__cxx11::string::~string((string *)&prefix);
    std::__cxx11::string::~string((string *)&local_118);
    this_00 = &local_d0;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&prefix,"\n",(allocator<char> *)&local_118);
    for (sVar2 = dimension_index; sVar2 < 9; sVar2 = sVar2 + 1) {
      std::__cxx11::string::append((char *)&prefix);
    }
    std::__cxx11::string::string(local_90,(string *)var_type);
    std::__cxx11::string::string<std::allocator<char>>(local_b0,"[]",(allocator<char> *)&local_d0);
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[6])(&local_118,this,local_90,local_b0,dimension_index);
    std::__cxx11::string::append((string *)&prefix);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::append((char *)&prefix);
    iVar1 = 3;
    do {
      iVar1 = iVar1 + -1;
      if (iVar1 == 0) break;
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::string((string *)&local_50,(string *)var_type);
      std::__cxx11::string::string((string *)&local_70,(string *)init_string);
      recursively_initialise(&local_118,this,&local_50,dimension_index - 1,&local_70);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::assign((char *)&prefix);
    } while (dimension_index != 1);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    this_00 = &prefix;
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string ConstructorsAndUnsizedDeclStructConstructors<API>::recursively_initialise(std::string var_type,
																					  size_t	  dimension_index,
																					  std::string init_string)
{
	std::string temp_string;

	if (dimension_index == 0)
	{
		temp_string = var_type + "(" + init_string + ")";
	}
	else
	{
		std::string prefix = "\n";

		for (size_t indent_index = dimension_index; indent_index < (API::MAX_ARRAY_DIMENSIONS + 1); indent_index++)
		{
			prefix += "    ";
		}

		prefix += this->extend_string(var_type, "[]", dimension_index);
		prefix += "(";

		for (int sub_script_index = 0; sub_script_index < 2; sub_script_index++)
		{
			temp_string += prefix;
			temp_string += recursively_initialise(var_type, dimension_index - 1, init_string);
			prefix = ", ";

			if (dimension_index == 1)
			{
				break;
			}
		}
		temp_string += ")";
	}

	return temp_string;
}